

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcRepresentationContext::IfcRepresentationContext(&this->super_IfcRepresentationContext,vtt + 1);
  pvVar1 = vtt[5];
  *(void **)&(this->super_IfcRepresentationContext).field_0x60 = pvVar1;
  *(void **)(&(this->super_IfcRepresentationContext).field_0x60 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[6];
  *(undefined8 *)&(this->super_IfcRepresentationContext).field_0x68 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcRepresentationContext).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentationContext).field_0x60 = vtt[8];
  (this->Precision).have = false;
  (this->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->WorldCoordinateSystem).
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&(this->TrueNorth).ptr.obj + 1) = 0;
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}